

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QGraphicsProxyWidget * QWidgetPrivate::nearestGraphicsProxyWidget(QWidget *origin)

{
  long lVar1;
  QGraphicsProxyWidget *pQVar2;
  
  while( true ) {
    if (origin == (QWidget *)0x0) {
      return (QGraphicsProxyWidget *)0x0;
    }
    lVar1 = *(long *)(*(long *)&origin->field_0x8 + 0x78);
    if ((lVar1 != 0) &&
       (pQVar2 = *(QGraphicsProxyWidget **)(lVar1 + 0x10), pQVar2 != (QGraphicsProxyWidget *)0x0))
    break;
    origin = *(QWidget **)(*(long *)&origin->field_0x8 + 0x10);
  }
  return pQVar2;
}

Assistant:

QGraphicsProxyWidget *QWidgetPrivate::nearestGraphicsProxyWidget(const QWidget *origin)
{
    if (origin) {
        const auto &extra = origin->d_func()->extra;
        if (extra && extra->proxyWidget)
            return extra->proxyWidget;
        return nearestGraphicsProxyWidget(origin->parentWidget());
    }
    return nullptr;
}